

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O2

Registry * tvm::runtime::Registry::Register(string *name,bool override)

{
  Manager *this;
  iterator iVar1;
  ostream *poVar2;
  mapped_type pRVar3;
  mapped_type *ppRVar4;
  LogMessageFatal LStack_1a8;
  
  this = Manager::Global();
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this,name);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>,_true>
      ._M_cur == (__node_type *)0x0) {
    pRVar3 = (mapped_type)operator_new(0x40);
    (pRVar3->name_).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pRVar3->name_).field_2 + 8) = 0;
    (pRVar3->name_)._M_dataplus._M_p = (pointer)&(pRVar3->name_).field_2;
    (pRVar3->name_)._M_string_length = 0;
    *(undefined8 *)&(pRVar3->func_).body_.super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(pRVar3->func_).body_.super__Function_base._M_functor + 8) = 0;
    (pRVar3->func_).body_.super__Function_base._M_manager = (_Manager_type)0x0;
    (pRVar3->func_).body_._M_invoker = (_Invoker_type)0x0;
    std::__cxx11::string::_M_assign((string *)pRVar3);
    ppRVar4 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this,name);
    *ppRVar4 = pRVar3;
  }
  else {
    if (!override) {
      dmlc::LogMessageFatal::LogMessageFatal
                (&LStack_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/registry.cc"
                 ,0x50);
      poVar2 = std::operator<<((ostream *)&LStack_1a8,"Check failed: override");
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = std::operator<<(poVar2,"Global PackedFunc ");
      poVar2 = std::operator<<(poVar2,(string *)name);
      std::operator<<(poVar2," is already registered");
      dmlc::LogMessageFatal::~LogMessageFatal(&LStack_1a8);
    }
    pRVar3 = *(mapped_type *)
              ((long)iVar1.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>,_true>
                     ._M_cur + 0x28);
  }
  return pRVar3;
}

Assistant:

Registry &Registry::Register(const std::string &name, bool override) { // NOLINT(*)
  Manager *m = Manager::Global();
  //std::lock_guard<std::mutex> lock(m->mutex);
  auto it = m->fmap.find(name);
  if (it == m->fmap.end()) {
    Registry *r = new Registry();
    r->name_ = name;
    m->fmap[name] = r;
    return *r;
  } else {
    CHECK(override)
        << "Global PackedFunc " << name << " is already registered";
    return *it->second;
  }
}